

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::Expression::visit<slang::ast::(anonymous_namespace)::PortBackrefVisitor&>
          (Expression *this,PortBackrefVisitor *visitor)

{
  DistItem *item;
  MemberSetter *setter;
  
  (*(code *)(&DAT_00423538 + *(int *)(&DAT_00423538 + (ulong)this->kind * 4)))();
  return;
}

Assistant:

decltype(auto) Expression::visit(TVisitor&& visitor, Args&&... args) const {
    return visitExpression(this, visitor, std::forward<Args>(args)...);
}